

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.hpp
# Opt level: O1

back_insert_iterator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
 pstore::utf::
 code_point_to_utf8<unsigned_char,std::back_insert_iterator<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>>
           (char32_t c,
           back_insert_iterator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
           out)

{
  ulong uVar1;
  byte bVar2;
  ulong uVar3;
  uint uVar4;
  
  uVar1 = (ulong)(uint)c;
  do {
    uVar3 = uVar1;
    uVar4 = (uint)uVar3;
    if (uVar4 < 0x80) goto LAB_001a8813;
    if (uVar4 < 0x800) {
      bVar2 = (byte)(uVar4 >> 6) | 0xc0;
      goto LAB_001a8800;
    }
    uVar1 = 0xfffd;
  } while (0x10ffff < uVar4 || (uVar4 & 0xfffff800) == 0xd800);
  if (uVar4 < 0x10000) {
    bVar2 = (byte)(uVar4 >> 0xc) | 0xe0;
  }
  else {
    std::__cxx11::
    basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
    push_back(out.container,(byte)(uVar4 >> 0x12) | 0xf0);
    bVar2 = (byte)(uVar3 >> 0xc) & 0x3f | 0x80;
  }
  std::__cxx11::
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
  push_back(out.container,bVar2);
  bVar2 = (byte)(uVar3 >> 6) & 0x3f | 0x80;
LAB_001a8800:
  std::__cxx11::
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
  push_back(out.container,bVar2);
  uVar3 = (ulong)((byte)uVar3 & 0x3f | 0x80);
LAB_001a8813:
  std::__cxx11::
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
  push_back(out.container,(uchar)uVar3);
  return (back_insert_iterator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
          )out.container;
}

Assistant:

auto code_point_to_utf8 (char32_t const c, OutputIt out) -> OutputIt {
            if (c < 0x80) {
                *(out++) = static_cast<CharType> (c);
            } else if (c < 0x800) {
                *(out++) = static_cast<CharType> (c / 64U + 0xC0U);
                *(out++) = static_cast<CharType> (c % 64U + 0x80U);
            } else if ((c >= 0xD800 && c < 0xE000) || c >= 0x110000) {
                out = replacement_char<CharType> (out);
            } else if (c < 0x10000) {
                *(out++) = static_cast<CharType> ((c / 0x1000U) | 0xE0U);
                *(out++) = static_cast<CharType> ((c / 64U % 64U) | 0x80U);
                *(out++) = static_cast<CharType> ((c % 64U) | 0x80U);
            } else {
                PSTORE_ASSERT (c < 0x110000);
                *(out++) = static_cast<CharType> ((c / 0x40000U) | 0xF0U);
                *(out++) = static_cast<CharType> ((c / 0x1000U % 64U) | 0x80U);
                *(out++) = static_cast<CharType> ((c / 64U % 64U) | 0x80U);
                *(out++) = static_cast<CharType> ((c % 64U) | 0x80U);
            }
            return out;
        }